

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::String&,char_const(&)[29]>
          (String *__return_storage_ptr__,kj *this,String *params,char (*params_1) [29])

{
  long lVar1;
  ArrayPtr<const_char> local_30;
  long local_20;
  long local_18;
  
  lVar1 = *(long *)(this + 8);
  local_20 = lVar1;
  if (lVar1 != 0) {
    local_20 = *(long *)this;
  }
  local_18 = 0;
  if (lVar1 != 0) {
    local_18 = lVar1 + -1;
  }
  local_30 = toCharSequence<char_const(&)[29]>((char (*) [29])params);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_20,&local_30,&local_30);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}